

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImRect::Add(ImRect *this,ImVec2 *p)

{
  float fVar1;
  ImVec2 *p_local;
  ImRect *this_local;
  
  fVar1 = (this->Min).x;
  if (p->x <= fVar1 && fVar1 != p->x) {
    (this->Min).x = p->x;
  }
  fVar1 = (this->Min).y;
  if (p->y <= fVar1 && fVar1 != p->y) {
    (this->Min).y = p->y;
  }
  if ((this->Max).x < p->x) {
    (this->Max).x = p->x;
  }
  if ((this->Max).y < p->y) {
    (this->Max).y = p->y;
  }
  return;
}

Assistant:

void        Add(const ImVec2& p)                { if (Min.x > p.x)     Min.x = p.x;     if (Min.y > p.y)     Min.y = p.y;     if (Max.x < p.x)     Max.x = p.x;     if (Max.y < p.y)     Max.y = p.y; }